

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::FileOrDirectoryExists(FilePath *this)

{
  int iVar1;
  char *in_RDI;
  StatStruct file_stat;
  StatStruct *in_stack_ffffffffffffff58;
  undefined1 local_98 [152];
  
  memset(local_98,0,0x90);
  std::__cxx11::string::c_str();
  iVar1 = posix::Stat(in_RDI,in_stack_ffffffffffffff58);
  return iVar1 == 0;
}

Assistant:

bool FilePath::FileOrDirectoryExists() const {
#if GTEST_OS_WINDOWS_MOBILE
  LPCWSTR unicode = String::AnsiToUtf16(pathname_.c_str());
  const DWORD attributes = GetFileAttributes(unicode);
  delete[] unicode;
  return attributes != kInvalidFileAttributes;
#else
  posix::StatStruct file_stat{};
  return posix::Stat(pathname_.c_str(), &file_stat) == 0;
#endif  // GTEST_OS_WINDOWS_MOBILE
}